

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::operador_relacional(Sintatico *this)

{
  uint need;
  bool bVar1;
  undefined8 extraout_RAX;
  allocator<char> aStack_d1;
  string sStack_d0;
  string sStack_b0;
  string sStack_90;
  string sStack_70;
  string sStack_50;
  string sStack_30;
  
  need = this->tok;
  if ((0x1e < need) || ((0x70000070U >> (need & 0x1f) & 1) == 0)) {
    return;
  }
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,need);
  if (bVar1) {
    avancar(this);
    saltBlank(this);
    return;
  }
  if (need == 0xd) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_90,")",&aStack_d1);
    error(this,&sStack_90);
LAB_0010259b:
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_70,",",&aStack_d1);
    error(this,&sStack_70);
LAB_001025be:
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_b0,"do",&aStack_d1);
    error(this,&sStack_b0);
LAB_001025e1:
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_d0,"then",&aStack_d1);
    error(this,&sStack_d0);
  }
  else {
    if (need == 0x12) goto LAB_0010259b;
    if (need == 0x2a) goto LAB_001025be;
    if (need == 0x20) goto LAB_001025e1;
    if (need != 0x27) {
      if (need != 0x15) {
        return;
      }
      goto LAB_0010262d;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_50,"program",&aStack_d1);
  error(this,&sStack_50);
LAB_0010262d:
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_30,";",&aStack_d1);
  error(this,&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Sintatico::operador_relacional() {
  switch (tok) {
    case IGUAL     : eat(IGUAL)     ; break;
    case DIFERENTE : eat(DIFERENTE) ; break;
    case MENOR     : eat(MENOR)     ; break;
    case MENORIGUAL: eat(MENORIGUAL); break;
    case MAIORIGUAL: eat(MAIORIGUAL); break;
    case MAIOR     : eat(MAIOR)     ; break;
  }
}